

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *specialFunctions)

{
  _Rb_tree_color _Var1;
  pointer pNVar2;
  long lVar3;
  _Base_ptr __n;
  pointer pcVar4;
  string *psVar5;
  _Rb_tree_color __val;
  _Rep_type *p_Var6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *ppVar7;
  pointer pbVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  pointer pFVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  iterator iVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  pointer pRVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command;
  string *psVar21;
  string *psVar22;
  VulkanHppGenerator *pVVar23;
  undefined8 uVar24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pEVar25;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command_1;
  pointer pNVar26;
  bool condition;
  string handleProtect;
  string __str;
  string enter;
  string leave;
  string titleProtect;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  firstLevelCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  secondLevelCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  secondLevelCommands_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  firstLevelCommands_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  listedCommands;
  undefined1 local_248 [32];
  int local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
  local_220;
  string *local_1d8;
  pointer local_1d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_1c8;
  VulkanHppGenerator *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [32];
  pointer local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  undefined1 local_108 [40];
  pointer local_e0;
  pointer local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar12 = (this->m_features).
            super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->m_features).
             super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = __return_storage_ptr__;
  local_1c8 = handle;
  local_1c0 = this;
  local_110 = &specialFunctions->_M_t;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar12 != local_48) {
    local_c0 = &(specialFunctions->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_c8 = (_Base_ptr)&(handle->second).commands;
    local_118 = (pointer)&(handle->second).commands._M_t._M_impl.super__Rb_tree_header;
    local_d0 = (_Base_ptr)&(handle->second).secondLevelCommands;
    local_d8 = (pointer)&(handle->second).secondLevelCommands._M_t._M_impl.super__Rb_tree_header;
    do {
      local_138._0_8_ = (string *)0x0;
      local_138._8_8_ = (string *)0x0;
      local_138._16_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      local_108._0_8_ = (string *)0x0;
      local_108._8_8_ = (string *)0x0;
      pRVar17 = (pFVar12->requireData).
                super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (pFVar12->requireData).
                 super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_1d0 = pFVar12;
      if (pRVar17 == local_40) {
LAB_0018e8d3:
        if (local_108._0_8_ != local_108._8_8_) goto LAB_0018e8e9;
      }
      else {
        do {
          pNVar2 = (pRVar17->commands).
                   super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_38 = pRVar17;
          for (pNVar26 = (pRVar17->commands).
                         super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                         ._M_impl.super__Vector_impl_data._M_start; pNVar26 != pNVar2;
              pNVar26 = pNVar26 + 1) {
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(local_110,&pNVar26->name);
            if (cVar13._M_node == local_c0) {
              cVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(local_c8,&pNVar26->name);
              if ((pointer)cVar13._M_node == local_118) {
                cVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find(local_d0,&pNVar26->name);
                if ((pointer)cVar13._M_node != local_d8) {
                  iVar15 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                           ::find(&local_80,&pNVar26->name);
                  if ((_Rb_tree_header *)iVar15._M_node == &local_80._M_impl.super__Rb_tree_header)
                  {
                    lVar3 = *(long *)&((_Rep_type *)&local_1d0->name)->_M_impl;
                    local_248._0_8_ = (VulkanHppGenerator *)(local_248 + 0x10);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_248,lVar3,
                               *(long *)&(((_Rep_type *)&local_1d0->name)->_M_impl).
                                         super__Rb_tree_header._M_header + lVar3);
                    local_228 = pNVar26->xmlLine;
                    std::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                    ::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                              (&local_220,&pNVar26->name,(NameLine *)local_248);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                    ::
                    _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                                *)&local_80,&local_220);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_220.second.name._M_dataplus._M_p != &local_220.second.name.field_2)
                    {
                      operator_delete(local_220.second.name._M_dataplus._M_p,
                                      local_220.second.name.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
                      operator_delete(local_220.first._M_dataplus._M_p,
                                      local_220.first.field_2._M_allocated_capacity + 1);
                    }
                    if ((VulkanHppGenerator *)local_248._0_8_ !=
                        (VulkanHppGenerator *)(local_248 + 0x10)) {
                      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                    }
                    if ((local_1c8->first)._M_string_length == 0) {
                      __assert_fail("!handle.first.empty()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                    ,0x2378,
                                    "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                                   );
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_108,&pNVar26->name);
                  }
                  else {
                    __n = iVar15._M_node[2]._M_parent;
                    if (__n == *(_Base_ptr *)
                                &(((_Rep_type *)&local_1d0->name)->_M_impl).super__Rb_tree_header.
                                 _M_header) {
                      if (__n == (_Base_ptr)0x0) {
                        condition = true;
                      }
                      else {
                        iVar10 = bcmp(*(void **)(iVar15._M_node + 2),
                                      *(void **)&((_Rep_type *)&local_1d0->name)->_M_impl,
                                      (size_t)__n);
                        condition = iVar10 == 0;
                      }
                    }
                    else {
                      condition = false;
                    }
                    iVar10 = pNVar26->xmlLine;
                    std::operator+(&local_178,"command <",&pNVar26->name);
                    pbVar16 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&local_178,"> already listed as required for feature <");
                    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar16->_M_dataplus)._M_p;
                    paVar18 = &pbVar16->field_2;
                    if (paVar19 == paVar18) {
                      local_198.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                      local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
                    }
                    else {
                      local_198.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                      local_198._M_dataplus._M_p = (pointer)paVar19;
                    }
                    local_198._M_string_length = pbVar16->_M_string_length;
                    (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
                    pbVar16->_M_string_length = 0;
                    (pbVar16->field_2)._M_local_buf[0] = '\0';
                    pbVar16 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_append(&local_198,*(char **)(iVar15._M_node + 2),
                                        (size_type)iVar15._M_node[2]._M_parent);
                    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar16->_M_dataplus)._M_p;
                    paVar18 = &pbVar16->field_2;
                    if (paVar19 == paVar18) {
                      local_158.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
                    }
                    else {
                      local_158.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                      local_158._M_dataplus._M_p = (pointer)paVar19;
                    }
                    local_158._M_string_length = pbVar16->_M_string_length;
                    (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
                    pbVar16->_M_string_length = 0;
                    (pbVar16->field_2)._M_local_buf[0] = '\0';
                    pbVar16 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&local_158,"> on line ");
                    local_248._0_8_ = local_248 + 0x10;
                    pVVar23 = (VulkanHppGenerator *)(pbVar16->_M_dataplus)._M_p;
                    paVar19 = &pbVar16->field_2;
                    local_e0 = (pointer)CONCAT44(local_e0._4_4_,iVar10);
                    if (pVVar23 == (VulkanHppGenerator *)paVar19) {
                      local_248._16_8_ = paVar19->_M_allocated_capacity;
                      local_248._24_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
                    }
                    else {
                      local_248._16_8_ = paVar19->_M_allocated_capacity;
                      local_248._0_8_ = pVVar23;
                    }
                    local_248._8_8_ = pbVar16->_M_string_length;
                    (pbVar16->_M_dataplus)._M_p = (pointer)paVar19;
                    pbVar16->_M_string_length = 0;
                    (pbVar16->field_2)._M_local_buf[0] = '\0';
                    _Var1 = iVar15._M_node[3]._M_color;
                    __val = -_Var1;
                    if (0 < (int)_Var1) {
                      __val = _Var1;
                    }
                    __len = 1;
                    if (9 < __val) {
                      uVar20 = (ulong)__val;
                      uVar9 = 4;
                      do {
                        __len = uVar9;
                        uVar11 = (uint)uVar20;
                        if (uVar11 < 100) {
                          __len = __len - 2;
                          goto LAB_0018e6be;
                        }
                        if (uVar11 < 1000) {
                          __len = __len - 1;
                          goto LAB_0018e6be;
                        }
                        if (uVar11 < 10000) goto LAB_0018e6be;
                        uVar20 = uVar20 / 10000;
                        uVar9 = __len + 4;
                      } while (99999 < uVar11);
                      __len = __len + 1;
                    }
LAB_0018e6be:
                    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_construct(&local_1b8,(ulong)(-((int)_Var1 >> 0x1f) + __len),'-');
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              (local_1b8._M_dataplus._M_p + (uint)-((int)_Var1 >> 0x1f),__len,__val)
                    ;
                    uVar20 = 0xf;
                    if ((VulkanHppGenerator *)local_248._0_8_ !=
                        (VulkanHppGenerator *)(local_248 + 0x10)) {
                      uVar20 = local_248._16_8_;
                    }
                    if (uVar20 < local_248._8_8_ + local_1b8._M_string_length) {
                      uVar24 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                        uVar24 = local_1b8.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar24 < local_248._8_8_ + local_1b8._M_string_length)
                      goto LAB_0018e75f;
                      pbVar16 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                replace(&local_1b8,0,0,(char *)local_248._0_8_,local_248._8_8_);
                    }
                    else {
LAB_0018e75f:
                      pbVar16 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_248,local_1b8._M_dataplus._M_p,
                                          local_1b8._M_string_length);
                    }
                    local_220.first._M_dataplus._M_p = (pointer)&local_220.first.field_2;
                    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar16->_M_dataplus)._M_p;
                    paVar19 = &pbVar16->field_2;
                    if (paVar18 == paVar19) {
                      local_220.first.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity
                      ;
                      local_220.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
                    }
                    else {
                      local_220.first.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity
                      ;
                      local_220.first._M_dataplus._M_p = (pointer)paVar18;
                    }
                    local_220.first._M_string_length = pbVar16->_M_string_length;
                    (pbVar16->_M_dataplus)._M_p = (pointer)paVar19;
                    pbVar16->_M_string_length = 0;
                    paVar19->_M_local_buf[0] = '\0';
                    checkForError(condition,(int)local_e0,&local_220.first);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
                      operator_delete(local_220.first._M_dataplus._M_p,
                                      local_220.first.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                      operator_delete(local_1b8._M_dataplus._M_p,
                                      local_1b8.field_2._M_allocated_capacity + 1);
                    }
                    if ((VulkanHppGenerator *)local_248._0_8_ !=
                        (VulkanHppGenerator *)(local_248 + 0x10)) {
                      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_198._M_dataplus._M_p != &local_198.field_2) {
                      operator_delete(local_198._M_dataplus._M_p,
                                      local_198.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                               local_178.field_2._M_local_buf[0]) + 1);
                    }
                  }
                }
              }
              else {
                cVar14 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                         ::find(&local_80,&pNVar26->name);
                if ((_Rb_tree_header *)cVar14._M_node != &local_80._M_impl.super__Rb_tree_header) {
                  __assert_fail("!listedCommands.contains( command.name )",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x236e,
                                "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                               );
                }
                lVar3 = *(long *)&((_Rep_type *)&local_1d0->name)->_M_impl;
                local_248._0_8_ = (VulkanHppGenerator *)(local_248 + 0x10);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_248,lVar3,
                           *(long *)&(((_Rep_type *)&local_1d0->name)->_M_impl).
                                     super__Rb_tree_header._M_header + lVar3);
                local_228 = pNVar26->xmlLine;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_220,&pNVar26->name,(NameLine *)local_248);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&local_80,&local_220);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220.second.name._M_dataplus._M_p != &local_220.second.name.field_2) {
                  operator_delete(local_220.second.name._M_dataplus._M_p,
                                  local_220.second.name.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
                  operator_delete(local_220.first._M_dataplus._M_p,
                                  local_220.first.field_2._M_allocated_capacity + 1);
                }
                if ((VulkanHppGenerator *)local_248._0_8_ !=
                    (VulkanHppGenerator *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_138,&pNVar26->name);
              }
            }
          }
          pRVar17 = local_38 + 1;
        } while (pRVar17 != local_40);
        if (local_138._0_8_ == local_138._8_8_) goto LAB_0018e8d3;
LAB_0018e8e9:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,"\n  //=== ",&local_1d0->name);
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_248," ===\n");
        paVar19 = &local_220.first.field_2;
        local_220.first._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
        paVar18 = &pbVar16->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.first._M_dataplus._M_p == paVar18) {
          local_220.first.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_220.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
          local_220.first._M_dataplus._M_p = (pointer)paVar19;
        }
        else {
          local_220.first.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_220.first._M_string_length = pbVar16->_M_string_length;
        (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar16->_M_string_length = 0;
        (pbVar16->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1d8,local_220.first._M_dataplus._M_p,local_220.first._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.first._M_dataplus._M_p != paVar19) {
          operator_delete(local_220.first._M_dataplus._M_p,
                          local_220.first.field_2._M_allocated_capacity + 1);
        }
        psVar21 = (string *)local_138._0_8_;
        psVar5 = (string *)local_138._8_8_;
        if ((VulkanHppGenerator *)local_248._0_8_ != (VulkanHppGenerator *)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          psVar21 = (string *)local_138._0_8_;
          psVar5 = (string *)local_138._8_8_;
        }
        for (; uVar24 = local_108._8_8_, psVar22 = (string *)local_108._0_8_, psVar21 != psVar5;
            psVar21 = psVar21 + 1) {
          generateRAIIHandleCommand
                    (&local_220.first,local_1c0,psVar21,
                     (ulong)((local_1c8->first)._M_string_length != 0),false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1d8,local_220.first._M_dataplus._M_p,local_220.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
            operator_delete(local_220.first._M_dataplus._M_p,
                            local_220.first.field_2._M_allocated_capacity + 1);
          }
        }
        for (; psVar22 != (string *)uVar24; psVar22 = psVar22 + 1) {
          if ((local_1c8->first)._M_string_length == 0) {
            __assert_fail("!handle.first.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x238f,
                          "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                         );
          }
          generateRAIIHandleCommand(&local_220.first,local_1c0,psVar22,2,false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1d8,local_220.first._M_dataplus._M_p,local_220.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
            operator_delete(local_220.first._M_dataplus._M_p,
                            local_220.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      pFVar12 = local_1d0 + 1;
    } while (pFVar12 != local_48);
  }
  pEVar25 = (local_1c0->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (local_1c0->m_extensions).
             super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar25 != local_e0) {
    p_Var6 = (_Rep_type *)&local_110->_M_impl;
    local_c0 = (_Base_ptr)&(local_1c8->second).commands;
    local_c8 = &(local_1c8->second).commands._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1d0 = (pointer)&(local_1c8->second).secondLevelCommands;
    local_d0 = &(local_1c8->second).secondLevelCommands._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    do {
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      pRVar17 = (pEVar25->requireData).
                super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = (pEVar25->requireData).
                 super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_118 = pEVar25;
      if (pRVar17 == local_d8) {
LAB_0018ed99:
        if (local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0018edaf;
      }
      else {
        do {
          pNVar2 = (pRVar17->commands).
                   super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pNVar26 = (pRVar17->commands).
                         super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                         ._M_impl.super__Vector_impl_data._M_start; pNVar26 != pNVar2;
              pNVar26 = pNVar26 + 1) {
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(local_110,&pNVar26->name);
            if (((_Rb_tree_header *)cVar13._M_node == &(p_Var6->_M_impl).super__Rb_tree_header) &&
               (cVar14 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                         ::find(&local_80,&pNVar26->name),
               (_Rb_tree_header *)cVar14._M_node == &local_80._M_impl.super__Rb_tree_header)) {
              cVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(local_c0,&pNVar26->name);
              if (cVar13._M_node == local_c8) {
                cVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1d0,&pNVar26->name);
                if (cVar13._M_node == local_d0) goto LAB_0018ed69;
                local_248._0_8_ = local_248 + 0x10;
                pcVar4 = (pEVar25->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_248,pcVar4,pcVar4 + (pEVar25->name)._M_string_length);
                local_228 = pNVar26->xmlLine;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_220,&pNVar26->name,(NameLine *)local_248);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&local_80,&local_220);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220.second.name._M_dataplus._M_p != &local_220.second.name.field_2) {
                  operator_delete(local_220.second.name._M_dataplus._M_p,
                                  local_220.second.name.field_2._M_allocated_capacity + 1);
                }
                pEVar25 = local_118;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
                  operator_delete(local_220.first._M_dataplus._M_p,
                                  local_220.first.field_2._M_allocated_capacity + 1);
                }
                if ((VulkanHppGenerator *)local_248._0_8_ !=
                    (VulkanHppGenerator *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                }
                this_00 = &local_b8;
              }
              else {
                local_248._0_8_ = local_248 + 0x10;
                pcVar4 = (pEVar25->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_248,pcVar4,pcVar4 + (pEVar25->name)._M_string_length);
                local_228 = pNVar26->xmlLine;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_220,&pNVar26->name,(NameLine *)local_248);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&local_80,&local_220);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220.second.name._M_dataplus._M_p != &local_220.second.name.field_2) {
                  operator_delete(local_220.second.name._M_dataplus._M_p,
                                  local_220.second.name.field_2._M_allocated_capacity + 1);
                }
                pEVar25 = local_118;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
                  operator_delete(local_220.first._M_dataplus._M_p,
                                  local_220.first.field_2._M_allocated_capacity + 1);
                }
                if ((VulkanHppGenerator *)local_248._0_8_ !=
                    (VulkanHppGenerator *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                }
                this_00 = &local_98;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this_00,&pNVar26->name);
            }
LAB_0018ed69:
          }
          pRVar17 = pRVar17 + 1;
        } while (pRVar17 != local_d8);
        if (local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0018ed99;
LAB_0018edaf:
        pVVar23 = local_1c0;
        ppVar7 = local_1c8;
        getProtectFromType((string *)local_248,local_1c0,&local_1c8->first);
        getProtectFromTitle(&local_158,pVVar23,&pEVar25->name);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198._M_string_length = 0;
        local_198.field_2._M_allocated_capacity =
             local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_178._M_string_length = 0;
        local_178.field_2._M_local_buf[0] = '\0';
        if ((local_158._M_string_length != 0) &&
           ((local_158._M_string_length != local_248._8_8_ ||
            (pVVar23 = (VulkanHppGenerator *)local_248._0_8_,
            iVar10 = bcmp(local_158._M_dataplus._M_p,(void *)local_248._0_8_,
                          local_158._M_string_length), iVar10 != 0)))) {
          generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_220,pVVar23,&local_158,true);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_198,&local_220.first);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_178,&local_220.second.name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.second.name._M_dataplus._M_p != &local_220.second.name.field_2) {
            operator_delete(local_220.second.name._M_dataplus._M_p,
                            local_220.second.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
            operator_delete(local_220.first._M_dataplus._M_p,
                            local_220.first.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"\n",&local_198);
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,"  //=== ");
        local_138._0_8_ = local_138 + 0x10;
        psVar5 = (string *)(pbVar16->_M_dataplus)._M_p;
        paVar19 = &pbVar16->field_2;
        if (psVar5 == (string *)paVar19) {
          local_138._16_8_ = paVar19->_M_allocated_capacity;
          local_138._24_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        }
        else {
          local_138._16_8_ = paVar19->_M_allocated_capacity;
          local_138._0_8_ = psVar5;
        }
        local_138._8_8_ = pbVar16->_M_string_length;
        (pbVar16->_M_dataplus)._M_p = (pointer)paVar19;
        pbVar16->_M_string_length = 0;
        (pbVar16->field_2)._M_local_buf[0] = '\0';
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,(pEVar25->name)._M_dataplus._M_p,
                            (pEVar25->name)._M_string_length);
        local_1b8._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
        paVar19 = &pbVar16->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p == paVar19) {
          local_1b8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
        }
        local_1b8._M_string_length = pbVar16->_M_string_length;
        (pbVar16->_M_dataplus)._M_p = (pointer)paVar19;
        pbVar16->_M_string_length = 0;
        (pbVar16->field_2)._M_local_buf[0] = '\0';
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_1b8," ===\n");
        local_220.first._M_dataplus._M_p = (pointer)&local_220.first.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar16->_M_dataplus)._M_p;
        paVar18 = &pbVar16->field_2;
        if (paVar19 == paVar18) {
          local_220.first.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_220.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        }
        else {
          local_220.first.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_220.first._M_dataplus._M_p = (pointer)paVar19;
        }
        local_220.first._M_string_length = pbVar16->_M_string_length;
        (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar16->_M_string_length = 0;
        (pbVar16->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1d8,local_220.first._M_dataplus._M_p,local_220.first._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
          operator_delete(local_220.first._M_dataplus._M_p,
                          local_220.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_138._0_8_ != (string *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
        }
        psVar21 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((string *)local_108._0_8_ != (string *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
          psVar21 = local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar5 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar8 = local_b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            psVar22 = local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, psVar21 != psVar5;
            psVar21 = psVar21 + 1) {
          generateRAIIHandleCommand
                    (&local_220.first,local_1c0,psVar21,
                     (ulong)((ppVar7->first)._M_string_length != 0),false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1d8,local_220.first._M_dataplus._M_p,local_220.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
            operator_delete(local_220.first._M_dataplus._M_p,
                            local_220.first.field_2._M_allocated_capacity + 1);
          }
        }
        for (; psVar22 != pbVar8; psVar22 = psVar22 + 1) {
          if ((ppVar7->first)._M_string_length == 0) {
            __assert_fail("!handle.first.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x23bb,
                          "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                         );
          }
          generateRAIIHandleCommand(&local_220.first,local_1c0,psVar22,2,false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1d8,local_220.first._M_dataplus._M_p,local_220.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220.first._M_dataplus._M_p != &local_220.first.field_2) {
            operator_delete(local_220.first._M_dataplus._M_p,
                            local_220.first.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1d8,local_178._M_dataplus._M_p,local_178._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((VulkanHppGenerator *)local_248._0_8_ != (VulkanHppGenerator *)(local_248 + 0x10)) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      pEVar25 = pEVar25 + 1;
    } while (pEVar25 != local_e0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ::~_Rb_tree(&local_80);
  return local_1d8;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations( std::pair<std::string, HandleData> const & handle,
                                                                       std::set<std::string> const &              specialFunctions ) const
{
  std::string                     functionDeclarations;
  std::map<std::string, NameLine> listedCommands;  // some commands are listed with more than one extension !
  for ( auto const & feature : m_features )
  {
    std::vector<std::string> firstLevelCommands, secondLevelCommands;

    for ( auto const & require : feature.requireData )
    {
      for ( auto const & command : require.commands )
      {
        if ( !specialFunctions.contains( command.name ) )
        {
          if ( handle.second.commands.contains( command.name ) )
          {
            assert( !listedCommands.contains( command.name ) );
            listedCommands.insert( { command.name, { feature.name, command.xmlLine } } );
            firstLevelCommands.push_back( command.name );
          }
          else if ( handle.second.secondLevelCommands.contains( command.name ) )
          {
            auto listedIt = listedCommands.find( command.name );
            if ( listedIt == listedCommands.end() )
            {
              listedCommands.insert( { command.name, { feature.name, command.xmlLine } } );
              assert( !handle.first.empty() );
              secondLevelCommands.push_back( command.name );
            }
            else
            {
              checkForError( listedIt->second.name == feature.name,
                             command.xmlLine,
                             "command <" + command.name + "> already listed as required for feature <" + listedIt->second.name + "> on line " +
                               std::to_string( listedIt->second.xmlLine ) );
            }
          }
        }
      }
    }
    if ( !firstLevelCommands.empty() || !secondLevelCommands.empty() )
    {
      functionDeclarations += "\n  //=== " + feature.name + " ===\n";
      for ( auto const & command : firstLevelCommands )
      {
        functionDeclarations += generateRAIIHandleCommand( command, handle.first.empty() ? 0 : 1, false );
      }
      for ( auto const & command : secondLevelCommands )
      {
        assert( !handle.first.empty() );
        functionDeclarations += generateRAIIHandleCommand( command, 2, false );
      }
    }
  }

  for ( auto const & extension : m_extensions )
  {
    std::vector<std::string> firstLevelCommands, secondLevelCommands;
    for ( auto & req : extension.requireData )
    {
      for ( auto const & command : req.commands )
      {
        if ( !specialFunctions.contains( command.name ) && !listedCommands.contains( command.name ) )
        {
          if ( handle.second.commands.contains( command.name ) )
          {
            listedCommands.insert( { command.name, { extension.name, command.xmlLine } } );
            firstLevelCommands.push_back( command.name );
          }
          else if ( handle.second.secondLevelCommands.contains( command.name ) )
          {
            listedCommands.insert( { command.name, { extension.name, command.xmlLine } } );
            secondLevelCommands.push_back( command.name );
          }
        }
      }
    }
    if ( !firstLevelCommands.empty() || !secondLevelCommands.empty() )
    {
      std::string handleProtect = getProtectFromType( handle.first );
      std::string titleProtect  = getProtectFromTitle( extension.name );
      std::string enter, leave;
      if ( !titleProtect.empty() && ( titleProtect != handleProtect ) )
      {
        std::tie( enter, leave ) = generateProtection( titleProtect );
      }
      functionDeclarations += "\n" + enter + "  //=== " + extension.name + " ===\n";
      for ( auto const & command : firstLevelCommands )
      {
        functionDeclarations += generateRAIIHandleCommand( command, handle.first.empty() ? 0 : 1, false );
      }
      for ( auto const & command : secondLevelCommands )
      {
        assert( !handle.first.empty() );
        functionDeclarations += generateRAIIHandleCommand( command, 2, false );
      }
      functionDeclarations += leave;
    }
  }
  return functionDeclarations;
}